

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

int32_t __thiscall
fasttext::Dictionary::getStringNoNewline
          (Dictionary *this,string_view in,vector<int,_std::allocator<int>_> *words,
          vector<int,_std::allocator<int>_> *labels)

{
  pointer piVar1;
  element_type *peVar2;
  iterator __position;
  entry_type eVar3;
  int32_t iVar4;
  void *pvVar5;
  size_t sVar6;
  size_type sVar7;
  size_type __rlen;
  ulong __n;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  int iVar11;
  size_t sVar12;
  uint32_t h;
  size_t sVar13;
  char *__s1;
  string_view w;
  string_view token;
  vector<int,_std::allocator<int>_> word_hashes;
  int local_7c;
  char *local_70;
  vector<int,_std::allocator<int>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  vector<int,_std::allocator<int>_> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  local_70 = in._M_str;
  sVar10 = in._M_len;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  piVar1 = (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar1;
  }
  piVar1 = (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  __n = 0;
  __s1 = (char *)0x0;
  local_7c = 0;
  local_40 = labels;
  local_38 = words;
  do {
    sVar13 = 0xffffffffffffffff;
    if (sVar10 != 0) {
      sVar12 = 0;
      do {
        pvVar5 = memchr(" \n\r\t\v\f",(int)local_70[sVar12],6);
        sVar13 = sVar12;
        if (pvVar5 == (void *)0x0) break;
        sVar12 = sVar12 + 1;
        sVar13 = 0xffffffffffffffff;
      } while (sVar10 != sVar12);
    }
    if (sVar13 == 0xffffffffffffffff) {
      local_70 = local_70 + sVar10;
      sVar10 = 0;
    }
    else {
      __s1 = local_70 + sVar13;
      uVar9 = sVar10 - sVar13;
      __n = 0xffffffffffffffff;
      if (uVar9 != 0) {
        uVar8 = 0;
        do {
          pvVar5 = memchr(" \n\r\t\v\f",(int)__s1[uVar8],6);
          __n = uVar8;
          if (pvVar5 != (void *)0x0) break;
          uVar8 = uVar8 + 1;
          __n = 0xffffffffffffffff;
        } while (uVar9 != uVar8);
      }
      if (uVar9 < __n) {
        __n = uVar9;
      }
      local_70 = __s1 + __n;
      sVar10 = uVar9 - __n;
    }
    if (sVar13 == 0xffffffffffffffff) {
LAB_00127732:
      addWordNgrams(this,local_38,&local_68,
                    ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->wordNgrams);
      if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return local_7c;
    }
    h = 0x811c9dc5;
    if (__n != 0) {
      sVar6 = 0;
      do {
        h = ((int)__s1[sVar6] ^ h) * 0x1000193;
        sVar6 = sVar6 + 1;
      } while (__n != sVar6);
    }
    w._M_str = __s1;
    w._M_len = __n;
    iVar4 = find(this,w,h);
    iVar11 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iVar4];
    if (iVar11 < 0) {
      peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_50._M_len = __n;
      local_50._M_str = __s1;
      sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        (&local_50,(peVar2->label)._M_dataplus._M_p,0,
                         (peVar2->label)._M_string_length);
      eVar3 = sVar7 == 0;
    }
    else {
      eVar3 = getType(this,iVar11);
    }
    if (eVar3 == word) {
      token._M_str = __s1;
      token._M_len = __n;
      addSubwords(this,local_38,token,iVar11);
      local_50._M_len = CONCAT44(local_50._M_len._4_4_,h);
      if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_50);
      }
      else {
        *local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = h;
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    else if ((-1 < iVar11) && (eVar3 == label)) {
      iVar11 = iVar11 - this->nwords_;
      local_50._M_len = CONCAT44(local_50._M_len._4_4_,iVar11);
      __position._M_current =
           (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
      if (__position._M_current ==
          (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (local_40,__position,(int *)&local_50);
      }
      else {
        *__position._M_current = iVar11;
        (local_40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
    }
    local_7c = local_7c + 1;
    if ((__n == DAT_0014c470) &&
       ((__n == 0 || (iVar11 = bcmp(__s1,EOS_abi_cxx11_,__n), iVar11 == 0)))) goto LAB_00127732;
  } while( true );
}

Assistant:

int32_t Dictionary::getStringNoNewline(
    std::string_view in,
    std::vector<int32_t>& words,
    std::vector<int32_t>& labels) const {
  std::vector<int32_t> word_hashes;
  std::string_view token;
  int32_t ntokens = 0;

  words.clear();
  labels.clear();
  while (readWordNoNewline(in, token)) {
    uint32_t h = hash(token);
    int32_t wid = getId(token, h);
    entry_type type = wid < 0 ? getType(token) : getType(wid);

    ntokens++;
    if (type == entry_type::word) {
      addSubwords(words, token, wid);
      word_hashes.push_back(h);
    } else if (type == entry_type::label && wid >= 0) {
      labels.push_back(wid - nwords_);
    }
    if (token == EOS) {
      break;
    }
  }
  addWordNgrams(words, word_hashes, args_->wordNgrams);
  return ntokens;
}